

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_meta_make_filled_dims.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  int iVar2;
  char *pcVar3;
  
  if (boost::detail::report_errors_remind()::r == '\0') {
    boost::report_errors();
  }
  boost::detail::report_errors_remind()::r = 1;
  if (boost::detail::report_errors_remind()::r == '\0') {
    boost::report_errors();
  }
  iVar2 = boost::detail::test_errors()::x;
  if (boost::detail::test_errors()::x == 0) {
    poVar1 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"No errors detected.",0x13);
    iVar2 = 0;
  }
  else {
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,boost::detail::test_errors()::x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," error",6);
    pcVar3 = "";
    if (iVar2 != 1) {
      pcVar3 = "s";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,(ulong)(iVar2 != 1));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," detected.",10);
    iVar2 = 1;
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return iVar2;
}

Assistant:

int main()
{
    BOOST_TEST((is_same<
        make_filled_dims_t<0, 1>, dimensions<>
    >::value));

    BOOST_TEST((is_same<
        make_filled_dims_t<1, 1  >, dimensions<1>
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<1, 0  >, dimensions<0>
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<1, dyn>, dimensions<dyn>
    >::value));

    BOOST_TEST((is_same<
        make_filled_dims_t<2, 1  >, dimensions<1,   1  >
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<2, 0  >, dimensions<0,   0  >
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<2, dyn>, dimensions<dyn, dyn>
    >::value));

    BOOST_TEST((is_same<
        make_filled_dims_t<3, 1  >, dimensions<1,   1,   1  >
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<3, 0  >, dimensions<0,   0,   0  >
    >::value));
    BOOST_TEST((is_same<
        make_filled_dims_t<3, dyn>, dimensions<dyn, dyn, dyn>
    >::value));

    return boost::report_errors();
}